

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O1

ptr<srv_state> __thiscall nuraft::srv_state::deserialize_v1p(srv_state *this,buffer *buf)

{
  uint8_t uVar1;
  int32_t iVar2;
  uint64_t uVar3;
  undefined8 *puVar4;
  ptr<srv_state> pVar5;
  buffer_serializer bs;
  buffer_serializer bStack_38;
  
  buffer_serializer::buffer_serializer(&bStack_38,buf,LITTLE);
  buffer_serializer::get_u8(&bStack_38);
  uVar3 = buffer_serializer::get_u64(&bStack_38);
  iVar2 = buffer_serializer::get_i32(&bStack_38);
  uVar1 = buffer_serializer::get_u8(&bStack_38);
  *(undefined8 *)this = 0;
  puVar4 = (undefined8 *)operator_new(0x48);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_005bcd78;
  *(undefined1 *)(puVar4 + 2) = 1;
  puVar4[3] = uVar3;
  *(int32_t *)(puVar4 + 4) = iVar2;
  *(bool *)((long)puVar4 + 0x24) = uVar1 == '\x01';
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  (this->term_).super___atomic_base<unsigned_long>._M_i = (__int_type)puVar4;
  *(undefined8 **)this = puVar4 + 2;
  pVar5.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  pVar5.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<srv_state>)pVar5.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<srv_state> deserialize_v1p(buffer& buf) {
        buffer_serializer bs(buf);
        uint8_t ver = bs.get_u8();
        (void)ver;
        ulong term = bs.get_u64();
        int voted_for = bs.get_i32();
        bool et_allowed = (bs.get_u8() == 1);
        return cs_new<srv_state>(term, voted_for, et_allowed);
    }